

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_slookup(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int sn;
  char arg [4608];
  char buf [4608];
  char *in_stack_ffffffffffffdbd8;
  undefined4 in_stack_ffffffffffffdbe0;
  undefined4 in_stack_ffffffffffffdbe4;
  uint uVar2;
  char in_stack_ffffffffffffdbe8;
  uint7 in_stack_ffffffffffffdbe9;
  char *in_stack_ffffffffffffdbf0;
  char local_1218 [4632];
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffdbe4,in_stack_ffffffffffffdbe0),
               in_stack_ffffffffffffdbd8);
  if (in_stack_ffffffffffffdbe8 == '\0') {
    send_to_char(in_stack_ffffffffffffdbf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffdbe9 << 8));
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffdbe8,"all");
    if (bVar1) {
      uVar2 = skill_lookup((char *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
      if ((int)uVar2 < 0) {
        send_to_char(in_stack_ffffffffffffdbf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
      }
      else {
        sprintf(local_1218,"Sn: %3d  Skill/spell: \'%s\'\n\r",(ulong)uVar2,
                skill_table[(int)uVar2].name);
        send_to_char(in_stack_ffffffffffffdbf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
      }
    }
    else {
      uVar2 = 0;
      while (((int)uVar2 < 800 && (skill_table[(int)uVar2].name != (char *)0x0))) {
        sprintf(local_1218,"Sn: %3d  Skill/spell: \'%s\'\n\r",(ulong)uVar2,
                skill_table[(int)uVar2].name);
        send_to_char(in_stack_ffffffffffffdbf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8));
        uVar2 = uVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void do_slookup(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	int sn;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Lookup which skill or spell?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		for (sn = 0; sn < MAX_SKILL; sn++)
		{
			if (skill_table[sn].name == nullptr)
				break;

			sprintf(buf, "Sn: %3d  Skill/spell: '%s'\n\r", sn, skill_table[sn].name);
			send_to_char(buf, ch);
		}
	}
	else
	{
		sn = skill_lookup(arg);

		if (sn < 0)
		{
			send_to_char("No such skill or spell.\n\r", ch);
			return;
		}

		sprintf(buf, "Sn: %3d  Skill/spell: '%s'\n\r", sn, skill_table[sn].name);
		send_to_char(buf, ch);
	}
}